

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::TopKLayerParams::TopKLayerParams(TopKLayerParams *this,TopKLayerParams *from)

{
  TopKLayerParams *from_local;
  TopKLayerParams *this_local;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__TopKLayerParams_006f76a0;
  google::protobuf::internal::CachedSize::CachedSize(&this->_cached_size_);
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(from->super_MessageLite)._internal_metadata_);
  memcpy(&this->axis_,&from->axis_,0x11);
  return;
}

Assistant:

TopKLayerParams::TopKLayerParams(const TopKLayerParams& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite() {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  ::memcpy(&axis_, &from.axis_,
    static_cast<size_t>(reinterpret_cast<char*>(&usebottomk_) -
    reinterpret_cast<char*>(&axis_)) + sizeof(usebottomk_));
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.TopKLayerParams)
}